

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldDescriptorProto::SharedDtor(FieldDescriptorProto *this)

{
  string *psVar1;
  FieldDescriptorProto *pFVar2;
  FieldDescriptorProto *this_local;
  
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->name_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->extendee_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->type_name_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->default_value_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->json_name_,psVar1);
  pFVar2 = internal_default_instance();
  if ((this != pFVar2) && (this->options_ != (FieldOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void FieldDescriptorProto::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  extendee_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  type_name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  default_value_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  json_name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete options_;
  }
}